

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::FileOrDirectoryExists(FilePath *this)

{
  int iVar1;
  char *path;
  undefined1 local_a0 [8];
  StatStruct file_stat;
  FilePath *this_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)this;
  memset(local_a0,0,0x90);
  path = (char *)std::__cxx11::string::c_str();
  iVar1 = posix::Stat(path,(StatStruct *)local_a0);
  return iVar1 == 0;
}

Assistant:

bool FilePath::FileOrDirectoryExists() const {
#ifdef GTEST_OS_WINDOWS_MOBILE
  LPCWSTR unicode = String::AnsiToUtf16(pathname_.c_str());
  const DWORD attributes = GetFileAttributes(unicode);
  delete[] unicode;
  return attributes != kInvalidFileAttributes;
#else
  posix::StatStruct file_stat{};
  return posix::Stat(pathname_.c_str(), &file_stat) == 0;
#endif  // GTEST_OS_WINDOWS_MOBILE
}